

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined1 uVar2;
  RAnsBitDecoder *in_RDI;
  int i;
  RAnsBitDecoder decoder;
  bool last_orientation;
  int32_t num_orientations;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  DecoderBuffer *in_stack_ffffffffffffff98;
  RAnsBitDecoder *pRVar3;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_4c;
  RAnsBitDecoder local_38;
  byte local_1d;
  int local_1c;
  bool local_1;
  
  local_1c = 0;
  bVar1 = DecoderBuffer::Decode<int>
                    (in_stack_ffffffffffffff98,
                     (int *)CONCAT17(in_stack_ffffffffffffff97,
                                     CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)))
  ;
  if ((bVar1) && (-1 < local_1c)) {
    MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::ResizeOrientations
              ((MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
               in_stack_ffffffffffffff8c);
    local_1d = 1;
    pRVar3 = &local_38;
    RAnsBitDecoder::RAnsBitDecoder
              ((RAnsBitDecoder *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    uVar2 = RAnsBitDecoder::StartDecoding
                      (in_RDI,(DecoderBuffer *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if ((bool)uVar2) {
      for (local_4c = 0; local_4c < local_1c; local_4c = local_4c + 1) {
        in_stack_ffffffffffffff97 =
             RAnsBitDecoder::DecodeNextBit
                       ((RAnsBitDecoder *)
                        CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
        if (!(bool)in_stack_ffffffffffffff97) {
          local_1d = (local_1d ^ 0xff) & 1;
        }
        MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
        ::set_orientation((MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                           *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),(int)((ulong)pRVar3 >> 0x20),
                          SUB81((ulong)pRVar3 >> 0x18,0));
      }
      RAnsBitDecoder::EndDecoding(&local_38);
      local_1 = PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                ::DecodePredictionData
                          ((PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                            *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (DecoderBuffer *)0x218a06);
    }
    else {
      local_1 = false;
    }
    RAnsBitDecoder::~RAnsBitDecoder((RAnsBitDecoder *)0x218a28);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortableDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Decode the delta coded orientations.
  int32_t num_orientations = 0;
  if (!buffer->Decode(&num_orientations) || num_orientations < 0) {
    return false;
  }
  predictor_.ResizeOrientations(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (int i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    predictor_.set_orientation(i, last_orientation);
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}